

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

void __thiscall
cfd::TransactionController::InsertUnlockingScript
          (TransactionController *this,Txid *txid,uint32_t vout,
          vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *unlocking_scripts)

{
  bool bVar1;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *in_RCX;
  uint32_t in_EDX;
  Txid *in_RSI;
  long in_RDI;
  Transaction *pTVar2;
  ByteData *data;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *__range2_1;
  ScriptElement *element;
  iterator __end2;
  iterator __begin2;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *__range2;
  ScriptBuilder builder;
  Script script;
  uint32_t txin_index;
  AbstractTxInReference *in_stack_fffffffffffffe28;
  uint32_t in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  undefined4 uVar3;
  Script local_1b0;
  reference local_178;
  __normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
  local_170;
  __normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
  local_168;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *local_160;
  reference local_158;
  __normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
  local_150;
  __normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
  local_148;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_140;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *local_128;
  ScriptBuilder local_120;
  TxInReference local_f0;
  Script local_60;
  uint32_t local_24;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *local_20;
  
  pTVar2 = (Transaction *)(in_RDI + 0x10);
  local_20 = in_RCX;
  local_24 = core::Transaction::GetTxInIndex(pTVar2,in_RSI,in_EDX);
  core::Transaction::GetTxIn(&local_f0,pTVar2,local_24);
  core::AbstractTxInReference::GetUnlockingScript(in_stack_fffffffffffffe28);
  core::TxInReference::~TxInReference((TxInReference *)0x512876);
  bVar1 = core::Script::IsEmpty(&local_60);
  uVar3 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe34);
  if (bVar1) {
    core::Transaction::SetUnlockingScript((Transaction *)(in_RDI + 0x10),local_24,local_20);
  }
  else {
    core::ScriptBuilder::ScriptBuilder((ScriptBuilder *)0x512903);
    core::Script::GetElementList(&local_140,&local_60);
    local_128 = &local_140;
    local_148._M_current =
         (ScriptElement *)
         std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::begin
                   (local_128);
    local_150._M_current =
         (ScriptElement *)
         std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::end
                   (local_128);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&local_148,&local_150);
      if (!bVar1) break;
      local_158 = __gnu_cxx::
                  __normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
                  ::operator*(&local_148);
      core::ScriptBuilder::AppendElement(&local_120,local_158);
      __gnu_cxx::
      __normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
      ::operator++(&local_148);
    }
    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)pTVar2
              );
    local_160 = local_20;
    local_168._M_current =
         (ByteData *)
         std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::begin(local_20);
    local_170._M_current =
         (ByteData *)
         std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::end(local_160);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&local_168,&local_170);
      if (!bVar1) break;
      local_178 = __gnu_cxx::
                  __normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
                  ::operator*(&local_168);
      core::ScriptBuilder::AppendData(&local_120,local_178);
      __gnu_cxx::
      __normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
      ::operator++(&local_168);
    }
    pTVar2 = (Transaction *)(in_RDI + 0x10);
    in_stack_fffffffffffffe30 = local_24;
    core::ScriptBuilder::Build(&local_1b0,&local_120);
    core::Transaction::SetUnlockingScript(pTVar2,in_stack_fffffffffffffe30,&local_1b0);
    core::Script::~Script((Script *)CONCAT44(uVar3,in_stack_fffffffffffffe30));
    core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)0x512ac2);
  }
  core::Script::~Script((Script *)CONCAT44(uVar3,in_stack_fffffffffffffe30));
  return;
}

Assistant:

void TransactionController::InsertUnlockingScript(
    const Txid& txid, uint32_t vout,
    const std::vector<ByteData>& unlocking_scripts) {
  uint32_t txin_index = transaction_.GetTxInIndex(txid, vout);
  Script script = transaction_.GetTxIn(txin_index).GetUnlockingScript();
  if (script.IsEmpty()) {
    transaction_.SetUnlockingScript(txin_index, unlocking_scripts);
  } else {
    ScriptBuilder builder;
    for (const auto& element : script.GetElementList()) {
      builder.AppendElement(element);
    }
    for (const ByteData& data : unlocking_scripts) {
      builder.AppendData(data);
    }
    transaction_.SetUnlockingScript(txin_index, builder.Build());
  }
}